

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

Group * metaf::GroupParser::parseAlternative<10ul>
                  (string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  RunwayStateGroup *in_RDI;
  optional<metaf::RunwayStateGroup> parsed;
  ReportMetadata *in_stack_00000310;
  ReportPart in_stack_0000031c;
  string *in_stack_00000320;
  RunwayStateGroup *this;
  ReportMetadata *in_stack_ffffffffffffffd0;
  ReportPart in_stack_ffffffffffffffdc;
  string *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  RunwayStateGroup::parse(in_stack_00000320,in_stack_0000031c,in_stack_00000310);
  bVar1 = std::optional<metaf::RunwayStateGroup>::has_value
                    ((optional<metaf::RunwayStateGroup> *)0x26737d);
  if (bVar1) {
    std::optional<metaf::RunwayStateGroup>::operator*((optional<metaf::RunwayStateGroup> *)0x26738d)
    ;
    std::
    variant<metaf::KeywordGroup,metaf::LocationGroup,metaf::ReportTimeGroup,metaf::TrendGroup,metaf::WindGroup,metaf::VisibilityGroup,metaf::CloudGroup,metaf::WeatherGroup,metaf::TemperatureGroup,metaf::PressureGroup,metaf::RunwayStateGroup,metaf::SeaSurfaceGroup,metaf::MinMaxTemperatureGroup,metaf::PrecipitationGroup,metaf::LayerForecastGroup,metaf::PressureTendencyGroup,metaf::CloudTypesGroup,metaf::LowMidHighCloudGroup,metaf::LightningGroup,metaf::VicinityGroup,metaf::MiscGroup,metaf::UnknownGroup>
    ::variant<metaf::RunwayStateGroup_const&,void,void,metaf::RunwayStateGroup,void>
              ((variant<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                *)this,in_RDI);
  }
  else {
    parseAlternative<11ul>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
  }
  return (Group *)this;
}

Assistant:

static Group parseAlternative(const std::string & group,
		ReportPart reportPart,
		const ReportMetadata & reportMetadata)
	{
		using Alternative = std::variant_alternative_t<I, Group>;
		if constexpr (!std::is_same<Alternative, FallbackGroup>::value) {
			const auto parsed = Alternative::parse(group, reportPart, reportMetadata);
			if (parsed.has_value()) return *parsed;
		}
		if constexpr (I >= (std::variant_size_v<Group> - 1)) {
			return FallbackGroup();
		} else {
			return parseAlternative<I+1>(group, reportPart, reportMetadata);
		}
	}